

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O3

void nn_sock_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  undefined8 *puVar2;
  
  if (type == -3 && src == -2) {
LAB_0012d053:
    nn_sock_shutdown_cold_3();
  }
  else {
    if (*(int *)&self[1].fn != 3) {
      if (*(int *)&self[1].fn == 4) {
        if ((src != -2) || (type != 1)) {
          nn_sock_shutdown_cold_1();
          goto LAB_0012d107;
        }
        puVar2 = *(undefined8 **)self[1].shutdown_fn;
        goto LAB_0012d0e2;
      }
      nn_sock_shutdown_cold_2();
      goto LAB_0012d053;
    }
    if (type != 1 || src != 1) {
      return;
    }
    nn_list_erase((nn_list *)&self[3].owner,(nn_list_item *)((long)srcptr + 0x78));
    nn_ep_term((nn_ep *)srcptr);
    nn_free(srcptr);
  }
  iVar1 = nn_list_empty((nn_list *)&self[3].owner);
  if (iVar1 == 0) {
    return;
  }
  iVar1 = nn_list_empty((nn_list *)&self[3].state);
  if (iVar1 == 0) {
LAB_0012d107:
    nn_sock_shutdown_cold_4();
  }
  *(undefined4 *)&self[1].fn = 4;
  puVar2 = *(undefined8 **)self[1].shutdown_fn;
  if ((code *)*puVar2 != (code *)0x0) {
    (*(code *)*puVar2)();
    return;
  }
LAB_0012d0e2:
  (*(code *)puVar2[1])();
  *(undefined4 *)&self[1].fn = 5;
  nn_sem_post((nn_sem *)&self[2].ctx);
  return;
}

Assistant:

static void nn_sock_shutdown (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_sock *sock;
    struct nn_list_item *it;
    struct nn_ep *ep;

    sock = nn_cont (self, struct nn_sock, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        nn_assert (sock->state == NN_SOCK_STATE_ACTIVE);

        /*  Close sndfd and rcvfd. This should make any current
            select/poll using SNDFD and/or RCVFD exit. */
        if (!(sock->socktype->flags & NN_SOCKTYPE_FLAG_NORECV)) {
            nn_efd_stop (&sock->rcvfd);
        }
        if (!(sock->socktype->flags & NN_SOCKTYPE_FLAG_NOSEND)) {
            nn_efd_stop (&sock->sndfd);
        }

        /*  Ask all the associated endpoints to stop. */
        it = nn_list_begin (&sock->eps);
        while (it != nn_list_end (&sock->eps)) {
            ep = nn_cont (it, struct nn_ep, item);
            it = nn_list_next (&sock->eps, it);
            nn_list_erase (&sock->eps, &ep->item);
            nn_list_insert (&sock->sdeps, &ep->item,
                nn_list_end (&sock->sdeps));
            nn_ep_stop (ep);

        }
        sock->state = NN_SOCK_STATE_STOPPING_EPS;
        goto finish2;
    }
    if (nn_slow (sock->state == NN_SOCK_STATE_STOPPING_EPS)) {

        if (!(src == NN_SOCK_SRC_EP && type == NN_EP_STOPPED)) {
            /*  If we got here waiting for EPs to teardown, but src is
                not an EP, then it isn't safe for us to do anything,
                because we just need to wait for the EPs to finish
                up their thing.  Just bail. */
            return;
        }
        /*  Endpoint is stopped. Now we can safely deallocate it. */
        ep = (struct nn_ep*) srcptr;
        nn_list_erase (&sock->sdeps, &ep->item);
        nn_ep_term (ep);
        nn_free (ep);

finish2:
        /*  If all the endpoints are deallocated, we can start stopping
            protocol-specific part of the socket. If there' no stop function
            we can consider it stopped straight away. */
        if (!nn_list_empty (&sock->sdeps))
            return;
        nn_assert (nn_list_empty (&sock->eps));
        sock->state = NN_SOCK_STATE_STOPPING;
        if (!sock->sockbase->vfptr->stop)
            goto finish1;
        sock->sockbase->vfptr->stop (sock->sockbase);
        return;
    }
    if (nn_slow (sock->state == NN_SOCK_STATE_STOPPING)) {

        /*  We get here when the deallocation of the socket was delayed by the
            specific socket type. */
        nn_assert (src == NN_FSM_ACTION && type == NN_SOCK_ACTION_STOPPED);

finish1:
        /*  Protocol-specific part of the socket is stopped.
            We can safely deallocate it. */
        sock->sockbase->vfptr->destroy (sock->sockbase);
        sock->state = NN_SOCK_STATE_FINI;

        /*  Now we can unblock the application thread blocked in
            the nn_close() call. */
        nn_sem_post (&sock->termsem);

        return;
    }

    nn_fsm_bad_state(sock->state, src, type);
}